

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O0

bool __thiscall
jaegertracing::thrift::DependencyProcessor::dispatchCall
          (DependencyProcessor *this,TProtocol *iprot,TProtocol *oprot,string *fname,int32_t seqid,
          void *callContext)

{
  bool bVar1;
  element_type *peVar2;
  pointer ppVar3;
  size_t __n;
  long *plVar4;
  void *__buf;
  code *local_138;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [8];
  TApplicationException x;
  undefined1 local_68 [32];
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>
  local_48;
  iterator pfn;
  void *callContext_local;
  int32_t seqid_local;
  string *fname_local;
  TProtocol *oprot_local;
  TProtocol *iprot_local;
  DependencyProcessor *this_local;
  
  pfn._M_node = (_Base_ptr)callContext;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>
  ::_Rb_tree_iterator(&local_48);
  local_68._24_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
       ::find(&this->processMap_,fname);
  local_48._M_node = (_Base_ptr)local_68._24_8_;
  local_68._16_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>_>
       ::end(&this->processMap_);
  bVar1 = std::operator==(&local_48,(_Self *)(local_68 + 0x10));
  if (bVar1) {
    apache::thrift::protocol::TProtocol::skip(iprot,T_STRUCT);
    apache::thrift::protocol::TProtocol::readMessageEnd(iprot);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_68);
    peVar2 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    (*peVar2->_vptr_TTransport[8])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)local_68);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f8 + 0x10),"Invalid method name: \'",fname);
    std::operator+(&local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_f8 + 0x10),"\'");
    apache::thrift::TApplicationException::TApplicationException
              ((TApplicationException *)local_a8,UNKNOWN_METHOD,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)(local_f8 + 0x10));
    __n = (size_t)(uint)seqid;
    apache::thrift::protocol::TProtocol::writeMessageBegin(oprot,fname,T_EXCEPTION,seqid);
    apache::thrift::TApplicationException::write
              ((TApplicationException *)local_a8,(int)oprot,__buf,__n);
    apache::thrift::protocol::TProtocol::writeMessageEnd(oprot);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_f8);
    peVar2 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_f8);
    (*peVar2->_vptr_TTransport[10])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)local_f8);
    apache::thrift::protocol::TProtocol::getTransport((TProtocol *)local_108);
    peVar2 = std::
             __shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_108);
    (*peVar2->_vptr_TTransport[0xb])();
    std::shared_ptr<apache::thrift::transport::TTransport>::~shared_ptr
              ((shared_ptr<apache::thrift::transport::TTransport> *)local_108);
    apache::thrift::TApplicationException::~TApplicationException((TApplicationException *)local_a8)
    ;
  }
  else {
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(jaegertracing::thrift::DependencyProcessor::*)(int,_apache::thrift::protocol::TProtocol_*,_apache::thrift::protocol::TProtocol_*,_void_*)>_>
             ::operator->(&local_48);
    local_138 = (code *)ppVar3->second;
    plVar4 = (long *)((long)&(this->super_TDispatchProcessor).super_TProcessor._vptr_TProcessor +
                     *(long *)&ppVar3->field_0x28);
    if (((ulong)local_138 & 1) != 0) {
      local_138 = *(code **)(local_138 + *plVar4 + -1);
    }
    (*local_138)(plVar4,seqid,iprot,oprot,pfn._M_node);
  }
  return true;
}

Assistant:

bool DependencyProcessor::dispatchCall(::apache::thrift::protocol::TProtocol* iprot, ::apache::thrift::protocol::TProtocol* oprot, const std::string& fname, int32_t seqid, void* callContext) {
  ProcessMap::iterator pfn;
  pfn = processMap_.find(fname);
  if (pfn == processMap_.end()) {
    iprot->skip(::apache::thrift::protocol::T_STRUCT);
    iprot->readMessageEnd();
    iprot->getTransport()->readEnd();
    ::apache::thrift::TApplicationException x(::apache::thrift::TApplicationException::UNKNOWN_METHOD, "Invalid method name: '"+fname+"'");
    oprot->writeMessageBegin(fname, ::apache::thrift::protocol::T_EXCEPTION, seqid);
    x.write(oprot);
    oprot->writeMessageEnd();
    oprot->getTransport()->writeEnd();
    oprot->getTransport()->flush();
    return true;
  }
  (this->*(pfn->second))(seqid, iprot, oprot, callContext);
  return true;
}